

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

void cnn::TensorTools::RandomizeNormal(real mean,real stddev,Tensor *val)

{
  float *pfVar1;
  uint uVar2;
  long lVar3;
  result_type_conflict3 rVar4;
  normal_distribution<float> distribution;
  normal_distribution<float> local_38;
  
  local_38._M_saved = 0.0;
  local_38._M_saved_available = false;
  pfVar1 = val->v;
  local_38._M_param._M_mean = mean;
  local_38._M_param._M_stddev = stddev;
  uVar2 = Dim::size(&val->d);
  for (lVar3 = 0; (ulong)uVar2 << 2 != lVar3; lVar3 = lVar3 + 4) {
    rVar4 = std::normal_distribution<float>::operator()(&local_38,rndeng);
    *(result_type_conflict3 *)((long)pfVar1 + lVar3) = rVar4;
  }
  return;
}

Assistant:

void TensorTools::RandomizeNormal(real mean, real stddev, Tensor& val) {
  normal_distribution<real> distribution(mean, stddev);
  auto b = [&] {return distribution(*rndeng);};
#if HAVE_CUDA
  float* t = new float[val.d.size()];
  generate(t, t + val.d.size(), b);
  CUDA_CHECK(cudaMemcpy(val.v, t, sizeof(real) * val.d.size(), cudaMemcpyHostToDevice));
  delete[] t;
#else
  generate(val.v, val.v + val.d.size(), b);
#endif
}